

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void Blowfish_expandstate
               (blf_ctx *c,uint8_t *data,uint16_t databytes,uint8_t *key,uint16_t keybytes)

{
  uint32_t uVar1;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t datar;
  uint32_t datal;
  uint32_t temp;
  int iStack_30;
  uint16_t j;
  int k;
  int i;
  uint16_t keybytes_local;
  uint8_t *key_local;
  uint8_t *puStack_18;
  uint16_t databytes_local;
  uint8_t *data_local;
  blf_ctx *c_local;
  
  datal._2_2_ = 0;
  k._2_2_ = keybytes;
  _i = key;
  key_local._6_2_ = databytes;
  puStack_18 = data;
  data_local = (uint8_t *)c;
  for (iStack_30 = 0; iStack_30 < 0x12; iStack_30 = iStack_30 + 1) {
    datar = Blowfish_stream2word(_i,k._2_2_,(uint16_t *)((long)&datal + 2));
    *(uint *)(data_local + (long)iStack_30 * 4 + 0x1000) =
         *(uint *)(data_local + (long)iStack_30 * 4 + 0x1000) ^ datar;
  }
  datal._2_2_ = 0;
  local_40 = 0;
  local_44 = 0;
  for (iStack_30 = 0; iStack_30 < 0x12; iStack_30 = iStack_30 + 2) {
    uVar1 = Blowfish_stream2word(puStack_18,key_local._6_2_,(uint16_t *)((long)&datal + 2));
    local_40 = uVar1 ^ local_40;
    uVar1 = Blowfish_stream2word(puStack_18,key_local._6_2_,(uint16_t *)((long)&datal + 2));
    local_44 = uVar1 ^ local_44;
    Blowfish_encipher((blf_ctx *)data_local,&local_40,&local_44);
    *(uint32_t *)(data_local + (long)iStack_30 * 4 + 0x1000) = local_40;
    *(uint32_t *)(data_local + (long)(iStack_30 + 1) * 4 + 0x1000) = local_44;
  }
  for (iStack_30 = 0; iStack_30 < 4; iStack_30 = iStack_30 + 1) {
    for (temp = 0; (int)temp < 0x100; temp = temp + 2) {
      uVar1 = Blowfish_stream2word(puStack_18,key_local._6_2_,(uint16_t *)((long)&datal + 2));
      local_40 = uVar1 ^ local_40;
      uVar1 = Blowfish_stream2word(puStack_18,key_local._6_2_,(uint16_t *)((long)&datal + 2));
      local_44 = uVar1 ^ local_44;
      Blowfish_encipher((blf_ctx *)data_local,&local_40,&local_44);
      *(uint32_t *)(data_local + (long)(int)temp * 4 + (long)iStack_30 * 0x400) = local_40;
      *(uint32_t *)(data_local + (long)(int)(temp + 1) * 4 + (long)iStack_30 * 0x400) = local_44;
    }
  }
  return;
}

Assistant:

static void
Blowfish_expandstate(blf_ctx *c, const uint8_t *data, uint16_t databytes,
                     const uint8_t *key, uint16_t keybytes)
{
    int i;
    int k;
    uint16_t j;
    uint32_t temp;
    uint32_t datal;
    uint32_t datar;

    j = 0;
    for(i = 0; i < BLF_N + 2; i++) {
        /* Extract 4 int8 to 1 int32 from keystream */
        temp = Blowfish_stream2word(key, keybytes, &j);
        c->P[i] = c->P[i] ^ temp;
    }

    j = 0;
    datal = 0x00000000;
    datar = 0x00000000;
    for(i = 0; i < BLF_N + 2; i += 2) {
        datal ^= Blowfish_stream2word(data, databytes, &j);
        datar ^= Blowfish_stream2word(data, databytes, &j);
        Blowfish_encipher(c, &datal, &datar);

        c->P[i] = datal;
        c->P[i + 1] = datar;
    }

    for(i = 0; i < 4; i++) {
        for(k = 0; k < 256; k += 2) {
            datal ^= Blowfish_stream2word(data, databytes, &j);
            datar ^= Blowfish_stream2word(data, databytes, &j);
            Blowfish_encipher(c, &datal, &datar);

            c->S[i][k] = datal;
            c->S[i][k + 1] = datar;
        }
    }

}